

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.cpp
# Opt level: O0

Reals __thiscall Omega_h::measure_edges_metric(Omega_h *this,Mesh *mesh,LOs *a2e)

{
  LOs *pLVar1;
  void *extraout_RDX;
  Reals RVar2;
  allocator local_61;
  string local_60 [32];
  undefined1 local_40 [40];
  LOs *a2e_local;
  Mesh *mesh_local;
  
  local_40._32_8_ = a2e;
  a2e_local = (LOs *)mesh;
  mesh_local = (Mesh *)this;
  Read<int>::Read((Read<int> *)(local_40 + 0x10),a2e);
  pLVar1 = a2e_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"metric",&local_61);
  Mesh::get_array<double>((Mesh *)local_40,(Int)pLVar1,(string *)0x0);
  measure_edges_metric(this,mesh,(LOs *)(local_40 + 0x10),(Reals *)local_40);
  Read<double>::~Read((Read<double> *)local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  Read<int>::~Read((Read<int> *)(local_40 + 0x10));
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals measure_edges_metric(Mesh* mesh, LOs a2e) {
  return measure_edges_metric(mesh, a2e, mesh->get_array<Real>(VERT, "metric"));
}